

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day09.cpp
# Opt level: O2

void day09(input_t input)

{
  undefined1 auVar1 [32];
  undefined1 (*__ptr) [32];
  undefined1 (*pauVar2) [32];
  uint uVar3;
  uint uVar4;
  unsigned_long *s;
  long lVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  uint32_t turn;
  int32_t *Mend;
  vector<unsigned_long,_std::allocator<unsigned_long>_> score;
  anon_class_8_1_a68a8be0 load_next;
  anon_class_8_1_8980366c append;
  __m256i new_marbles;
  anon_class_64_8_da0cbc0f simulate;
  __m256i M;
  uint local_130;
  uint32_t local_12c;
  undefined1 (*local_128) [32];
  size_t local_120;
  undefined1 (*local_118) [32];
  int32_t *local_110;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  anon_class_8_1_a68a8be0 local_f0;
  anon_class_8_1_8980366c local_e8;
  longlong local_e0 [4];
  anon_class_64_8_da0cbc0f local_c0;
  __m256i local_80 [2];
  
  uVar3 = 0;
  uVar8 = 0;
  uVar13 = 0;
  for (lVar5 = 0; input.len != lVar5; lVar5 = lVar5 + 1) {
    bVar10 = input.s[lVar5] - 0x30;
    uVar7 = (uint)uVar8;
    uVar4 = uVar3;
    if (bVar10 < 10) {
      uVar12 = uVar7 * 10 + (uint)bVar10;
    }
    else {
      uVar11 = 0;
      uVar12 = uVar11;
      if (((uVar7 != 0) && (uVar12 = uVar7, input.s[lVar5] == ' ')) &&
         (uVar12 = uVar11, uVar4 = uVar7, uVar3 != 0)) {
        uVar13 = uVar8;
        uVar4 = uVar3;
      }
    }
    uVar3 = uVar4;
    uVar8 = (ulong)uVar12;
  }
  local_e0[0] = 0x180000001c;
  local_e0[1] = 0x190000001d;
  local_e0[2] = 0x1a0000001e;
  local_e0[3] = 0x1b0000001f;
  local_130 = uVar3;
  local_118 = (undefined1 (*) [32])aligned_alloc(0x20,(int)uVar13 * 0x180);
  *(undefined8 *)*local_118 = 0x1400000002;
  *(undefined8 *)(*local_118 + 8) = 0x150000000a;
  *(undefined8 *)(*local_118 + 0x10) = 0x1600000005;
  *(undefined8 *)(*local_118 + 0x18) = 0x10000000b;
  *(undefined8 *)local_118[1] = 0x60000000c;
  *(undefined8 *)(local_118[1] + 8) = 0x30000000d;
  *(undefined8 *)(local_118[1] + 0x10) = 0x70000000e;
  *(undefined8 *)(local_118[1] + 0x18) = 0xf;
  *(undefined8 *)(*local_118 + 0x18) = 0x10000000b;
  *(undefined8 *)local_118[1] = 0x60000000c;
  *(undefined8 *)(local_118[1] + 8) = 0x30000000d;
  *(undefined8 *)(local_118[1] + 0x10) = 0x70000000e;
  *(undefined8 *)(local_118[1] + 0x18) = 0xf;
  *(undefined8 *)local_118[2] = 0x800000010;
  *(undefined8 *)(local_118[2] + 8) = 0x400000011;
  *(undefined8 *)(local_118[2] + 0x10) = 0x1300000012;
  local_110 = (int32_t *)(local_118[2] + 0x18);
  uVar4 = uVar3;
  if (uVar3 % 0x17 == 0) {
    uVar4 = uVar3 / 0x17;
    local_130 = uVar3 / 0x17;
  }
  local_120 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,(ulong)uVar4,
             (allocator_type *)&local_c0);
  auVar1 = _DAT_00112520;
  local_c0.append = &local_e8;
  local_c0.load_next = &local_f0;
  local_128 = local_118 + 1;
  *local_108._M_impl.super__Vector_impl_data._M_start = 0x20;
  local_e8.Mend = &local_110;
  local_80[0] = (__m256i)vpermps_avx2(auVar1,*local_118);
  local_f0.Mnext = (int32_t **)&local_128;
  local_c0.turn = &local_12c;
  local_c0.M = local_80;
  local_c0.new_marbles = &local_e0;
  local_12c = 0x2e;
  local_c0.n_players = &local_130;
  uVar8 = 0;
  iVar14 = (int)(uVar13 / 0x17);
  local_c0.cur_player = &local_120;
  local_c0.score = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108;
  day09::anon_class_64_8_da0cbc0f::operator()(&local_c0,(ulong)(iVar14 - 1));
  for (puVar6 = local_108._M_impl.super__Vector_impl_data._M_start;
      puVar6 != local_108._M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    if (uVar8 <= *puVar6) {
      uVar8 = *puVar6;
    }
  }
  uVar3 = (uint)((int)uVar13 * 100) / 0x17;
  uVar4 = (uVar3 * 0x10 + 0x30) / 0x25;
  day09::anon_class_64_8_da0cbc0f::operator()(&local_c0,(ulong)(uVar4 - iVar14));
  __ptr = local_118;
  iVar14 = uVar3 - uVar4;
  pauVar2 = (undefined1 (*) [32])(local_128[3] + 8);
  local_128 = (undefined1 (*) [32])(local_128[1] + 8);
  while (pauVar9 = pauVar2, bVar15 = iVar14 != 0, iVar14 = iVar14 + -1, bVar15) {
    local_120 = local_120 + 1;
    if (local_130 <= local_120) {
      local_120 = 0;
    }
    uVar3 = *(int *)pauVar9[-2] + local_12c;
    local_12c = local_12c + 0x17;
    local_108._M_impl.super__Vector_impl_data._M_start[local_120] =
         local_108._M_impl.super__Vector_impl_data._M_start[local_120] + (ulong)uVar3;
    pauVar2 = pauVar9 + 2;
    local_128 = pauVar9;
  }
  uVar13 = 0;
  for (; local_108._M_impl.super__Vector_impl_data._M_start !=
         local_108._M_impl.super__Vector_impl_data._M_finish;
      local_108._M_impl.super__Vector_impl_data._M_start =
           local_108._M_impl.super__Vector_impl_data._M_start + 1) {
    if (uVar13 <= *local_108._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = *local_108._M_impl.super__Vector_impl_data._M_start;
    }
  }
  printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n",uVar8);
  free(__ptr);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_108);
  return;
}

Assistant:

void day09(input_t input) {
	uint32_t n_players = 0, n_points = 0;
	for (uint32_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
		} else if (n && *input.s == ' ') {
			(n_players ? n_points : n_players) = n;
			n = 0;
		}
	}

	// State after first round, from puzzle description
	constexpr std::array<int32_t, 22> initial = {
		 2, 20, 10, 21,  5, 22, 11,  1, 12,  6, 13,
		 3, 14,  7, 15,  0, 16,  8, 17,  4, 18, 19,
	};

	// Next marbles up for play, interleaved
	auto new_marbles = _mm256_setr_epi32(28, 24, 29, 25, 30, 26, 31, 27);

	// Initialize the playing field
	auto marbles = (int32_t *) aligned_alloc(32, n_points * 384);
	std::copy(initial.begin(), initial.end(), marbles);
	auto Mnext = marbles, Mend = marbles + 22;

	// Initialize score sheet
	if (n_players % 23 == 0) {
		n_players /= 23;
	}
	size_t cur_player = 0;
	std::vector<uint64_t> score(n_players);
	score[cur_player] = 32;

	const auto append = [&](size_t step, const __m256i& v) {
		_mm256_storeu_si256((__m256i *) Mend, v);
		Mend += step;
	};

	const auto load_next = [&]() {
		auto m = _mm256_load_si256((__m256i *) Mnext);
		Mnext += 8;
		return m;
	};

	// Prime the AVX2 register with the first group of 8 marbles
	auto M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));

	uint32_t turn = 46;

	auto simulate = [&](size_t count) {
		for (; count--; turn += 23) {
			// First 8 turns
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_set1_epi32(8));

			// Next 8 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 4, 1, 5, 2, 6, 3, 7));
			append(8, _mm256_blend_epi32(M, new_marbles, 0xaa));
			append(8, _mm256_shuffle_epi32(_mm256_blend_epi32(M, new_marbles, 0x55), 0xb1));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(0, 8, 6, 8, 4, 0, 5, 0));

			// Final 7 turns
			M = _mm256_permutevar8x32_epi32(load_next(), _mm256_setr_epi32(0, 3, 1, 5, 2, 4, 7, 6));
			append(5, _mm256_blend_epi32(M, new_marbles, 0xfa));

			cur_player++;
			cur_player &= -(cur_player < n_players);
			score[cur_player] += turn + _mm256_extract_epi32(M, 4);

			// Prepare the first 8 marbles of the next round
			M = _mm256_blend_epi32(_mm256_shuffle_epi32(M, 0x8d), new_marbles, 0x4c);
			M = _mm256_add_epi32(M, _mm256_setr_epi32(0, 0, 0, 4, 0, 0, 0, 0));

			new_marbles = _mm256_add_epi32(new_marbles, _mm256_setr_epi32(15, 7, 9, 7, 11, 15, 10, 15));
		}
	};

	// Part 1
	auto n_rounds1 = n_points / 23;
	simulate(n_rounds1 - 1);
	uint64_t part1 = 0;

	for (auto&& s : score) {
		part1 = std::max(part1, s);
	}

	// Part 2: 100x the number of points
	auto n_rounds2 = 100 * n_points / 23;

	// Simulate only enough to generate the scoreballs
	auto n_simulate2 = (n_rounds2 + 3) * 16 / 37;
	simulate(n_simulate2 - n_rounds1);
	n_rounds2 -= n_simulate2;

	// Tally up the remaining scoreballs
	for (Mnext += 10; n_rounds2--; Mnext += 16, turn += 23) {
		cur_player++;
		cur_player &= -(cur_player < n_players);
		score[cur_player] += turn + *Mnext;
	}

	uint64_t part2 = 0;
	for (auto&& s : score) {
		part2 = std::max(part2, s);
	}

	printf("Day 09 Part 1: %lu\nDay 09 Part 2: %lu\n", part1, part2);

	free(marbles);
}